

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          V *values,int num_keys)

{
  AlexNode<int,_int> *pAVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined8 in_XMM2_Qb;
  DataNodeStats stats;
  LinearModel<int> root_data_node_model;
  
  if ((0 < num_keys) && ((this->stats_).num_keys < 1)) {
    delete_node(this,this->root_node_);
    (this->stats_).num_keys = num_keys;
    pAVar1 = (AlexNode<int,_int> *)operator_new(0x40);
    pAVar1->is_leaf_ = false;
    pAVar1->duplication_factor_ = '\0';
    pAVar1->level_ = 0;
    pAVar1->cost_ = 0.0;
    pAVar1->_vptr_AlexNode = (_func_int **)&PTR__AlexModelNode_00113c88;
    pAVar1[1]._vptr_AlexNode = (_func_int **)&this->field_0xbd;
    pAVar1[1].is_leaf_ = false;
    pAVar1[1].duplication_factor_ = '\0';
    pAVar1[1].level_ = 0;
    pAVar1[1].model_.a_ = 0.0;
    this->root_node_ = pAVar1;
    dVar3 = 1.0 / (double)(values[(ulong)(uint)num_keys - 1].first - values->first);
    auVar4._0_8_ = (double)values->first;
    auVar4._8_8_ = in_XMM2_Qb;
    auVar2._8_8_ = 0x8000000000000000;
    auVar2._0_8_ = 0x8000000000000000;
    auVar2 = vxorpd_avx512vl(auVar4,auVar2);
    (pAVar1->model_).a_ = dVar3;
    (pAVar1->model_).b_ = dVar3 * auVar2._0_8_;
    root_data_node_model.a_ = 0.0;
    root_data_node_model.b_ = 0.0;
    AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
    build_model(values,num_keys,&root_data_node_model,(this->params_).approximate_model_computation)
    ;
    stats.num_search_iterations = 0.0;
    stats.num_shifts = 0.0;
    dVar3 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
            compute_expected_cost
                      (values,num_keys,0.7,(this->params_).expected_insert_frac,
                       &root_data_node_model,(this->params_).approximate_cost_computation,&stats);
    this->root_node_->cost_ = dVar3;
    bulk_load_node(this,values,num_keys,&this->root_node_,num_keys,&root_data_node_model);
    pAVar1 = this->root_node_;
    if (pAVar1->is_leaf_ == true) {
      pAVar1[4].model_.b_ = stats.num_search_iterations;
      pAVar1[4].cost_ = stats.num_shifts;
    }
    create_superroot(this);
    update_superroot_key_domain(this);
    link_all_data_nodes(this);
  }
  return;
}

Assistant:

void bulk_load(const V values[], int num_keys) {
    if (stats_.num_keys > 0 || num_keys <= 0) {
      return;
    }
    delete_node(root_node_);  // delete the empty root node from constructor

    stats_.num_keys = num_keys;

    // Build temporary root model, which outputs a CDF in the range [0, 1]
    root_node_ =
        new (model_node_allocator().allocate(1)) model_node_type(0, allocator_);
    T min_key = values[0].first;
    T max_key = values[num_keys - 1].first;
    root_node_->model_.a_ = 1.0 / (max_key - min_key);
    root_node_->model_.b_ = -1.0 * min_key * root_node_->model_.a_;

    // Compute cost of root node
    LinearModel<T> root_data_node_model;
    data_node_type::build_model(values, num_keys, &root_data_node_model,
                                params_.approximate_model_computation);
    DataNodeStats stats;
    root_node_->cost_ = data_node_type::compute_expected_cost(
        values, num_keys, data_node_type::kInitDensity_,
        params_.expected_insert_frac, &root_data_node_model,
        params_.approximate_cost_computation, &stats);

    // Recursively bulk load
    bulk_load_node(values, num_keys, root_node_, num_keys,
                   &root_data_node_model);

    if (root_node_->is_leaf_) {
      static_cast<data_node_type*>(root_node_)
          ->expected_avg_exp_search_iterations_ = stats.num_search_iterations;
      static_cast<data_node_type*>(root_node_)->expected_avg_shifts_ =
          stats.num_shifts;
    }

    create_superroot();
    update_superroot_key_domain();
    link_all_data_nodes();
  }